

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O1

void __thiscall CTcCodeStream::remove_fixup_at_ofs(CTcCodeStream *this,CTcCodeLabel *lbl,ulong ofs)

{
  CTcLabelFixup *pCVar1;
  CTcLabelFixup *pCVar2;
  CTcLabelFixup *pCVar3;
  
  if (lbl->fhead != (CTcLabelFixup *)0x0) {
    pCVar1 = lbl->fhead;
    pCVar3 = (CTcLabelFixup *)0x0;
    do {
      pCVar2 = pCVar1;
      pCVar1 = pCVar2->nxt;
      if (pCVar2->ofs == ofs) {
        if (pCVar3 == (CTcLabelFixup *)0x0) {
          pCVar3 = (CTcLabelFixup *)&lbl->fhead;
        }
        pCVar3->nxt = pCVar1;
        pCVar2->nxt = this->free_fixup_;
        this->free_fixup_ = pCVar2;
      }
      pCVar3 = pCVar2;
    } while (pCVar1 != (CTcLabelFixup *)0x0);
  }
  return;
}

Assistant:

void CTcCodeStream::remove_fixup_at_ofs(CTcCodeLabel *lbl, ulong ofs)
{
    CTcLabelFixup *fixup;
    CTcLabelFixup *prv;
    CTcLabelFixup *nxt;

    /* scan for a match */
    for (prv = 0, fixup = lbl->fhead ; fixup != 0 ; prv = fixup, fixup = nxt)
    {
        /* remember the next one */
        nxt = fixup->nxt;
        
        /* if this is a match, remove it */
        if (fixup->ofs == ofs)
        {
            /* unlink this fixup from the list */
            if (prv == 0)
                lbl->fhead = nxt;
            else
                prv->nxt = nxt;

            /* move it to the free list */
            fixup->nxt = free_fixup_;
            free_fixup_ = fixup;
        }
    }
}